

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O2

value * mjs::to_primitive(value *__return_storage_ptr__,value *v,value_type hint)

{
  gc_heap_ptr_untyped *p;
  long *plVar1;
  undefined8 *puVar2;
  uint uVar3;
  bool bVar4;
  object_ptr o;
  vector<mjs::value,_std::allocator<mjs::value>_> local_78;
  value *local_60;
  value fo;
  
  if (v->type_ != object) {
    value::value(__return_storage_ptr__,v);
    return __return_storage_ptr__;
  }
  p = &value::object_value(v)->super_gc_heap_ptr_untyped;
  gc_heap_ptr_untyped::gc_heap_ptr_untyped(&o.super_gc_heap_ptr_untyped,p);
  if (hint == undefined) {
    plVar1 = (long *)gc_heap_ptr_untyped::get(&o.super_gc_heap_ptr_untyped);
    hint = (**(code **)(*plVar1 + 0x18))(plVar1);
  }
  local_60 = v;
  if (hint - number < 2) {
    uVar3 = 0;
    do {
      if (uVar3 == 2) {
        puVar2 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar2 = &PTR__exception_00241620;
        __cxa_throw(puVar2,&to_primitive_failed_error::typeinfo,std::exception::~exception);
      }
      puVar2 = (undefined8 *)gc_heap_ptr_untyped::get(&o.super_gc_heap_ptr_untyped);
      bVar4 = (hint == string) != uVar3;
      local_78.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x1fa9d4;
      if (!bVar4) {
        local_78.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x1fc4f8;
      }
      local_78.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)((ulong)bVar4 + 7);
      (**(code **)*puVar2)(&fo,puVar2,&local_78);
      if (fo.type_ == object) {
        local_78.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_78.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_78.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        call_function(__return_storage_ptr__,&fo,local_60,&local_78);
        std::vector<mjs::value,_std::allocator<mjs::value>_>::~vector(&local_78);
        if (__return_storage_ptr__->type_ < object) {
          value::~value(&fo);
          gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&o.super_gc_heap_ptr_untyped);
          return __return_storage_ptr__;
        }
        value::~value(__return_storage_ptr__);
      }
      value::~value(&fo);
      uVar3 = uVar3 + 1;
    } while( true );
  }
  __assert_fail("hint == value_type::number || hint == value_type::string",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value.cpp",
                0x7c,"value mjs::to_primitive(const value &, value_type)");
}

Assistant:

value to_primitive(const value& v, value_type hint) {
    if (v.type() != value_type::object) {
        return v;
    }

    auto o = v.object_value();

    // [[DefaultValue]] (Hint)
    if (hint == value_type::undefined) {
        // When hint is undefined, assume Number unless it's a Date object in which case assume String
        hint = o->default_value_type();
    }

    assert(hint == value_type::number || hint == value_type::string);
    for (int i = 0; i < 2; ++i) {
        const wchar_t* const id = (hint == value_type::string) ^ i ? L"toString" : L"valueOf";
        const auto fo = o->get(id);
        if (fo.type() != value_type::object) {
            continue;
        }
        auto res = call_function(fo, v, {});
        if (!is_primitive(res.type())) {
            continue;
        }
        return res;
    }

    throw to_primitive_failed_error{};
}